

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

void __thiscall libDAI::NDP::SelectStateForVar(NDP *this,size_t varOrderI)

{
  value_type vVar1;
  reference vs;
  reference pvVar2;
  size_t __n;
  reference this_00;
  size_t i;
  ulong __n_00;
  nb_type vsI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indivIndices;
  multind mi;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  multind local_78;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  vs = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::at
                 (&this->_m_newFacs,varOrderI);
  NBFromVarSet((nb_type *)&local_a8,this,&vs->_vs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,
             (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&local_78);
  for (__n_00 = 0;
      __n_00 < (ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3);
      __n_00 = __n_00 + 1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,__n_00);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (&this->_m_bestConfiguration,*pvVar2);
    vVar1 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,__n_00);
    *pvVar2 = vVar1;
  }
  multind::multind(&local_78,&vs->_vs);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90);
  __n = multind::li(&local_78,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  this_00 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::at(&this->_m_bestResps,varOrderI);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(this_00,__n);
  vVar1 = *pvVar2;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this->_m_varOrder,varOrderI);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this->_m_bestConfiguration,*pvVar2);
  *pvVar2 = vVar1;
  multind::~multind(&local_78);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_90);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a8);
  return;
}

Assistant:

void NDP::SelectStateForVar(size_t varOrderI)
    {
        //get the factor that was introduced when eliminating varOrderI
        Factor& fI = _m_newFacs.at(varOrderI);
        
        //get the variables involved
        const VarSet & vs = fI.vars();
        nb_type vsI = NBFromVarSet(vs);
        
        //see what states they have selected
        std::vector<size_t> indivIndices( vsI.size() );
        for(size_t i=0; i < vsI.size(); i++)
        {
            size_t nvI = vsI.at(i);
            indivIndices.at(i) = _m_bestConfiguration.at(nvI);
        }

        //compute the joint state
        multind mi(vs);
        size_t jI = mi.li( indivIndices );
        //size_t jI2 = Factor::IndividualToJointFactorIndex(vs, indivIndices);
        //if (jI != jI2)
            //cout << "(jI != jI2): " << jI <<"!="<< jI2 << endl;

        //look up varOrderI's best response
        size_t br = _m_bestResps.at(varOrderI).at(jI);

        //register varOrderI's choice
        size_t varI = _m_varOrder.at(varOrderI);
        _m_bestConfiguration.at(varI) = br;
    }